

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O1

bool __thiscall
tinyusdz::usda::USDAReader::Impl::Read(Impl *this,uint32_t state_flags,bool as_primspec)

{
  AsciiParser *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  long *plVar4;
  size_type *psVar5;
  AsciiParserOption ascii_parser_option;
  string warn;
  ostringstream ss_w;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  AsciiParserOption local_1e3;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_1e3.allow_unknown_apiSchema = (this->_config).allow_unknown_apiSchema;
  local_1e3.allow_unknown_prim = (this->_config).allow_unknown_prims;
  local_1e3.strict_allowedToken_check = (this->_config).strict_allowedToken_check;
  StageMetaProcessor(this);
  RegisterPrimIdxAssignCallback(this);
  RegisterPrimSpecHandler(this);
  RegisterReconstructCallback<tinyusdz::Model>(this);
  RegisterReconstructCallback<tinyusdz::GPrim>(this);
  RegisterReconstructCallback<tinyusdz::Xform>(this);
  RegisterReconstructCallback<tinyusdz::GeomCube>(this);
  RegisterReconstructCallback<tinyusdz::GeomSphere>(this);
  RegisterReconstructCallback<tinyusdz::GeomCone>(this);
  RegisterReconstructCallback<tinyusdz::GeomPoints>(this);
  RegisterReconstructCallback<tinyusdz::GeomCylinder>(this);
  RegisterReconstructCallback<tinyusdz::GeomCapsule>(this);
  RegisterReconstructCallback<tinyusdz::GeomMesh>(this);
  RegisterReconstructCallback<tinyusdz::GeomSubset>(this);
  RegisterReconstructCallback<tinyusdz::GeomBasisCurves>(this);
  RegisterReconstructCallback<tinyusdz::GeomNurbsCurves>(this);
  RegisterReconstructCallback<tinyusdz::GeomCamera>(this);
  RegisterReconstructCallback<tinyusdz::Material>(this);
  RegisterReconstructCallback<tinyusdz::Shader>(this);
  RegisterReconstructCallback<tinyusdz::Scope>(this);
  RegisterReconstructCallback<tinyusdz::SphereLight>(this);
  RegisterReconstructCallback<tinyusdz::DomeLight>(this);
  RegisterReconstructCallback<tinyusdz::DiskLight>(this);
  RegisterReconstructCallback<tinyusdz::DistantLight>(this);
  RegisterReconstructCallback<tinyusdz::CylinderLight>(this);
  RegisterReconstructCallback<tinyusdz::SkelRoot>(this);
  RegisterReconstructCallback<tinyusdz::Skeleton>(this);
  RegisterReconstructCallback<tinyusdz::SkelAnimation>(this);
  RegisterReconstructCallback<tinyusdz::BlendShape>(this);
  this_00 = &this->_parser;
  (this->_parser)._primspec_mode = as_primspec;
  bVar2 = ascii::AsciiParser::Parse(this_00,state_flags,&local_1e3);
  ascii::AsciiParser::GetWarning_abi_cxx11_(&local_1e0,this_00);
  if (local_1e0._M_string_length != 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[warn]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Read",4);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a0,0x6a0);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::operator+(&local_208,"<USDAParser> ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e0
                    );
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_warn,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    ::std::ios_base::~ios_base(local_130);
  }
  if (!bVar2) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Read",4);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a0,0x6a4);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ascii::AsciiParser::GetError_abi_cxx11_(&local_1c0,this_00);
    plVar4 = (long *)::std::__cxx11::string::replace((ulong)&local_1c0,0,(char *)0x0,0x421035);
    paVar1 = &local_208.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_208.field_2._M_allocated_capacity = *psVar5;
      local_208.field_2._8_8_ = plVar4[3];
      local_208._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_208.field_2._M_allocated_capacity = *psVar5;
      local_208._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_208._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_208._M_dataplus._M_p,local_208._M_string_length);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_208._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
    ::std::ios_base::~ios_base(local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool USDAReader::Impl::Read(const uint32_t state_flags, bool as_primspec) {

  ///
  /// Convert parser option.
  ///
  ascii::AsciiParserOption ascii_parser_option;
  ascii_parser_option.allow_unknown_prim = _config.allow_unknown_prims;
  ascii_parser_option.allow_unknown_apiSchema = _config.allow_unknown_apiSchema;
  ascii_parser_option.strict_allowedToken_check = _config.strict_allowedToken_check;

  ///
  /// Setup callbacks.
  ///
  StageMetaProcessor();

  RegisterPrimIdxAssignCallback();

  // For composition(as_primspec == true)
  RegisterPrimSpecHandler();

  // For direct Prim reconstruction(load state = Toplevel)
  RegisterReconstructCallback<Model>();  // Generic prim.

  RegisterReconstructCallback<GPrim>(); // Geometric prim

  RegisterReconstructCallback<Xform>();
  RegisterReconstructCallback<GeomCube>();
  RegisterReconstructCallback<GeomSphere>();
  RegisterReconstructCallback<GeomCone>();
  RegisterReconstructCallback<GeomPoints>();
  RegisterReconstructCallback<GeomCylinder>();
  RegisterReconstructCallback<GeomCapsule>();
  RegisterReconstructCallback<GeomMesh>();
  RegisterReconstructCallback<GeomSubset>();
  RegisterReconstructCallback<GeomBasisCurves>();
  RegisterReconstructCallback<GeomNurbsCurves>();
  RegisterReconstructCallback<GeomCamera>();

  RegisterReconstructCallback<Material>();
  RegisterReconstructCallback<Shader>();

  RegisterReconstructCallback<Scope>();

  RegisterReconstructCallback<SphereLight>();
  RegisterReconstructCallback<DomeLight>();
  RegisterReconstructCallback<DiskLight>();
  RegisterReconstructCallback<DistantLight>();
  RegisterReconstructCallback<CylinderLight>();

  RegisterReconstructCallback<SkelRoot>();
  RegisterReconstructCallback<Skeleton>();
  RegisterReconstructCallback<SkelAnimation>();
  RegisterReconstructCallback<BlendShape>();

  _parser.set_primspec_mode(as_primspec);

  bool ret = _parser.Parse(state_flags, ascii_parser_option);

  std::string warn = _parser.GetWarning();
  if (!warn.empty()) {
    PUSH_WARN("<USDAParser> " + warn);
  }

  if (!ret) {
    PUSH_ERROR_AND_RETURN("Parse failed:\n" + _parser.GetError());
  }


  return true;
}